

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O0

void __thiscall QFileDialogComboBox::setHistory(QFileDialogComboBox *this,QStringList *paths)

{
  bool bVar1;
  ulong uVar2;
  qsizetype in_RSI;
  QModelIndex *in_RDI;
  long in_FS_OFFSET;
  QLatin1StringView QVar3;
  QUrl url;
  QModelIndex idx;
  QList<QUrl> list;
  QList<QString> *in_stack_fffffffffffffef8;
  char *str;
  undefined4 in_stack_ffffffffffffff10;
  uint in_stack_ffffffffffffff14;
  undefined1 in_stack_ffffffffffffff18 [16];
  QList<QUrl> *list_00;
  undefined5 in_stack_ffffffffffffff28;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  QModelIndex *pQVar7;
  undefined1 local_c0 [48];
  undefined1 local_90 [24];
  QUrl local_78 [4];
  undefined1 *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  undefined1 *local_40;
  undefined1 *local_38;
  undefined1 *local_30;
  QVariant local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar7 = in_RDI;
  QList<QString>::operator=((QList<QString> *)in_RDI,in_stack_fffffffffffffef8);
  local_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  local_30 = &DAT_aaaaaaaaaaaaaaaa;
  QList<QUrl>::QList((QList<QUrl> *)0x759288);
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  local_50 = &DAT_aaaaaaaaaaaaaaaa;
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  str = *(char **)(*(long *)(in_RDI + 2) + 0x300);
  QFileDialogPrivate::rootPath
            ((QFileDialogPrivate *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
  QFileSystemModel::index((QString *)&local_58,(int)str);
  QString::~QString((QString *)0x759304);
  local_78[0].d = (QUrlPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  bVar1 = QModelIndex::isValid(in_RDI);
  list_00 = in_stack_ffffffffffffff18._8_8_;
  bVar6 = 0;
  bVar5 = 0;
  bVar4 = 0;
  in_stack_ffffffffffffff14 = in_stack_ffffffffffffff14 & 0xffffff;
  if (bVar1) {
    QModelIndex::data(in_stack_ffffffffffffff18._0_8_,in_stack_ffffffffffffff14);
    bVar6 = 1;
    ::QVariant::toString();
    bVar5 = 1;
    QDir::toNativeSeparators((QString *)local_90);
    bVar4 = 1;
    QUrl::fromLocalFile((QString *)local_78);
  }
  else {
    QVar3 = Qt::Literals::StringLiterals::operator____L1(str,(size_t)in_RDI);
    list_00 = (QList<QUrl> *)QVar3.m_data;
    QVar3.m_data = (char *)pQVar7;
    QVar3.m_size = in_RSI;
    QString::QString((QString *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),QVar3)
    ;
    in_stack_ffffffffffffff14 = 0x1000000;
    QUrl::QUrl(local_78,(QString *)local_c0,TolerantMode);
  }
  if ((in_stack_ffffffffffffff14 & 0x1000000) != 0) {
    QString::~QString((QString *)0x7593f3);
  }
  if ((bVar4 & 1) != 0) {
    QString::~QString((QString *)0x759406);
  }
  if ((bVar5 & 1) != 0) {
    QString::~QString((QString *)0x759419);
  }
  if ((bVar6 & 1) != 0) {
    ::QVariant::~QVariant(&local_28);
  }
  uVar2 = QUrl::isValid();
  if ((uVar2 & 1) != 0) {
    QList<QUrl>::append((QList<QUrl> *)in_RDI,(parameter_type)in_stack_fffffffffffffef8);
  }
  QUrlModel::setUrls((QUrlModel *)
                     CONCAT17(bVar6,CONCAT16(bVar5,CONCAT15(bVar4,in_stack_ffffffffffffff28))),
                     list_00);
  QUrl::~QUrl(local_78);
  QList<QUrl>::~QList((QList<QUrl> *)0x759487);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QFileDialogComboBox::setHistory(const QStringList &paths)
{
    m_history = paths;
    // Only populate the first item, showPopup will populate the rest if needed
    QList<QUrl> list;
    const QModelIndex idx = d_ptr->model->index(d_ptr->rootPath());
    //On windows the popup display the "C:\", convert to nativeSeparators
    const QUrl url = idx.isValid()
                   ? QUrl::fromLocalFile(QDir::toNativeSeparators(idx.data(QFileSystemModel::FilePathRole).toString()))
                   : QUrl("file:"_L1);
    if (url.isValid())
        list.append(url);
    urlModel->setUrls(list);
}